

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessReenroll
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  element_type *this_00;
  Value *pVVar2;
  size_type sVar3;
  element_type *peVar4;
  const_reference pvVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  format_args args;
  ErrorCode local_274;
  Error local_270;
  Value local_248;
  anon_class_1_0_00000001 local_1fa;
  v10 local_1f9;
  v10 *local_1f8;
  size_t local_1f0;
  string local_1e8;
  Error local_1c8;
  Value local_1a0;
  ErrorCode local_158 [4];
  Error local_148;
  Value local_120;
  undefined1 local_d8 [8];
  CommissionerAppPtr commissioner;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Value **local_38;
  undefined1 *local_30;
  Value **local_28;
  Value **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_d8,(nullptr_t)0x0);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::GetSelectedCommissioner(&local_148,this_00,(CommissionerAppPtr *)local_d8);
  Value::Value(&local_120,&local_148);
  pVVar2 = Value::operator=(__return_storage_ptr__,&local_120);
  local_158[0] = kNone;
  bVar1 = Value::operator!=(pVVar2,local_158);
  Value::~Value(&local_120);
  Error::~Error(&local_148);
  if (!bVar1) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(aExpr);
    if (sVar3 < 2) {
      ProcessReenroll::anon_class_1_0_00000001::operator()(&local_1fa);
      local_58 = &local_1f8;
      local_60 = &local_1f9;
      bVar6 = ::fmt::v10::operator()(local_60);
      local_1f0 = bVar6.size_;
      local_1f8 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_68 = &local_1e8;
      local_78 = local_1f8;
      sStack_70 = local_1f0;
      local_50 = &local_78;
      local_88 = local_1f8;
      local_80 = local_1f0;
      local_48 = local_88;
      sStack_40 = local_80;
      value = (Value *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_30 = local_98;
      local_38 = &value;
      local_18 = 0;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_80;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      local_28 = local_38;
      local_20 = local_38;
      local_10 = local_30;
      ::fmt::v10::vformat_abi_cxx11_(&local_1e8,local_88,fmt,args);
      Error::Error(&local_1c8,kInvalidArgs,&local_1e8);
      Value::Value(&local_1a0,&local_1c8);
      Value::operator=(__return_storage_ptr__,&local_1a0);
      Value::~Value(&local_1a0);
      Error::~Error(&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    else {
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d8);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,1);
      (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x3e])
                (&local_270,peVar4,pvVar5);
      Value::Value(&local_248,&local_270);
      pVVar2 = Value::operator=(__return_storage_ptr__,&local_248);
      local_274 = kNone;
      Value::operator!=(pVVar2,&local_274);
      Value::~Value(&local_248);
      Error::~Error(&local_270);
    }
  }
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_d8);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessReenroll(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = commissioner->Reenroll(aExpr[1]));
exit:
    return value;
}